

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,
          vector<int,_std::allocator<int>_> *pixelTypes,char *data,size_t size)

{
  bool bVar1;
  khr_df_model_e kVar2;
  uint uVar3;
  uint32_t uVar4;
  khr_df_primaries_e kVar5;
  Reporter *report;
  Reporter *pRVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  uint *puVar10;
  reference ppuVar11;
  int in_ECX;
  byte in_DL;
  undefined4 uVar12;
  string *in_RSI;
  long in_RDI;
  FormatDescriptor *in_R8;
  uint in_R9D;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3 vVar13;
  uint in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  long in_stack_00000018;
  ulong in_stack_00000020;
  OutputStream file;
  size_t fileDataSize;
  EXRAttribute chromaticities;
  bool foundPrimaries;
  Primaries primaries;
  int i_1;
  value_type *channel_1;
  uint32_t c_1;
  EXRStruct exr;
  value_type *target;
  uint value;
  uint32_t bits;
  uint32_t offset;
  value_type *channel;
  uint32_t c;
  vec3 values;
  uint32_t pixel;
  char *rawPixel;
  uint32_t x;
  uint32_t y;
  uint32_t i;
  array<unsigned_int_*,_4UL> imagePtrs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  images;
  uint32_t numChannels;
  uint32_t pixelBytes;
  anon_class_16_2_3a950f92 addChannel;
  vector<Channel,_std::allocator<Channel>_> channels;
  char *in_stack_fffffffffffffa88;
  uint32_t uVar14;
  char *in_stack_fffffffffffffa90;
  value_type *__x;
  EXRStruct *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffab0;
  uint32_t in_stack_fffffffffffffab8;
  uint32_t in_stack_fffffffffffffabc;
  uint32_t in_stack_fffffffffffffac0;
  uint32_t in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  _khr_df_model_channels_e in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  uint in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf4;
  undefined1 in_stack_fffffffffffffaf8 [16];
  Reporter *in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  ReturnCode return_code;
  Reporter *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb28;
  uint32_t uVar15;
  OutputStream *in_stack_fffffffffffffb30;
  OutputStream local_4a8;
  void *local_480;
  EXRStruct local_478;
  char local_378 [256];
  undefined1 *local_278;
  undefined4 local_270;
  byte local_265;
  undefined1 local_264 [32];
  int local_244;
  reference local_240;
  uint local_234;
  void *local_1c8;
  void *local_1c0;
  uint local_1b8;
  undefined4 local_1b4;
  void *local_1b0;
  pointer local_1a0;
  uint local_198;
  uint local_190;
  int local_168;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  uint *local_148;
  uint local_13c;
  uint32_t local_138;
  uint32_t local_134;
  reference local_130;
  uint local_124;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined4 local_104;
  undefined4 *local_100;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  undefined1 local_e8 [40];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c0;
  uint local_a8;
  uint32_t local_a4;
  string local_a0 [32];
  string local_80 [48];
  FormatDescriptor *local_50;
  vector<Channel,_std::allocator<Channel>_> *local_48;
  vector<Channel,_std::allocator<Channel>_> local_40;
  uint local_24;
  FormatDescriptor *local_20;
  int local_18;
  byte local_11;
  
  return_code = (ReturnCode)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  local_11 = in_DL & 1;
  local_24 = in_R9D;
  local_20 = in_R8;
  local_18 = in_ECX;
  bVar1 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::empty
                    ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
                     in_stack_fffffffffffffaa0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!format.samples.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x367,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  if (((local_11 & 1) != 0) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa90,in_stack_fffffffffffffa88), bVar1)) {
    std::__cxx11::string::operator+=(in_RSI,".exr");
  }
  std::vector<Channel,_std::allocator<Channel>_>::vector
            ((vector<Channel,_std::allocator<Channel>_> *)0x270f0f);
  kVar2 = FormatDescriptor::model((FormatDescriptor *)0x270f1c);
  if (kVar2 == KHR_DF_MODEL_RGBSDA) {
    local_50 = local_20;
    local_48 = &local_40;
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((anon_class_16_2_3a950f92 *)
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc,
                      (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  }
  else {
    in_stack_fffffffffffffb30 = (OutputStream *)(in_RDI + 8);
    FormatDescriptor::model((FormatDescriptor *)0x271023);
    toString_abi_cxx11_((khr_df_model_e)in_stack_fffffffffffffaf4);
    toString_abi_cxx11_(return_code);
    Reporter::fatal<char_const(&)[42],std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffb18,return_code,(char (*) [42])in_stack_fffffffffffffb08,
               in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
  }
  local_a4 = FormatDescriptor::pixelByteCount(local_20);
  if (local_18 == 0x7b) {
    uVar15 = 3;
  }
  else {
    uVar15 = FormatDescriptor::channelCount(local_20);
  }
  local_a8 = uVar15;
  if (in_stack_00000020 != local_24 * in_stack_00000008 * local_a4) {
    __assert_fail("size == width * height * pixelBytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x392,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  report = (Reporter *)(ulong)uVar15;
  pRVar6 = (Reporter *)std::vector<int,_std::allocator<int>_>::size(in_stack_00000010);
  if (report != pRVar6) {
    __assert_fail("numChannels == pixelTypes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x393,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x2711d6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffab0,CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
           (allocator_type *)in_stack_fffffffffffffaa0);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x271202);
  memset(local_e8,0,0x20);
  for (local_ec = 0; local_ec < local_a8; local_ec = local_ec + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[](&local_c0,(ulong)local_ec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffab0,
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  }
  local_f0 = 0;
  do {
    if (in_stack_00000008 <= local_f0) {
      saveEXR::EXRStruct::EXRStruct(in_stack_fffffffffffffaa0);
      local_1a0 = std::array<unsigned_int_*,_4UL>::data((array<unsigned_int_*,_4UL> *)0x2719b4);
      local_198 = local_24;
      local_190 = local_a8;
      local_1b8 = local_a8;
      local_1c8 = malloc((long)(int)local_a8 * 0x110);
      local_1b4 = 0;
      for (local_234 = 0; local_234 < local_a8; local_234 = local_234 + 1) {
        local_240 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                              (&local_40,(ulong)local_234);
        strncpy((char *)((long)local_1c8 + (ulong)local_234 * 0x110),local_240->name,0xff);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](&local_c0,(ulong)local_234);
        puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x271aa5);
        ppuVar11 = std::array<unsigned_int_*,_4UL>::operator[]
                             ((array<unsigned_int_*,_4UL> *)in_stack_fffffffffffffa90,
                              (size_type)in_stack_fffffffffffffa88);
        *ppuVar11 = puVar10;
      }
      local_1c0 = malloc((long)(int)local_1b8 << 2);
      local_1b0 = malloc((long)(int)local_1b8 << 2);
      for (local_244 = 0; local_244 < (int)local_1b8; local_244 = local_244 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000010,(long)local_244);
        uVar12 = 2;
        if (*pvVar7 == 0) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)local_1c0 + (long)local_244 * 4) = uVar12;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000010,(long)local_244);
        *(value_type *)((long)local_1b0 + (long)local_244 * 4) = *pvVar7;
      }
      kVar5 = FormatDescriptor::primaries((FormatDescriptor *)0x271baf);
      local_265 = getPrimaries(kVar5);
      local_265 = local_265 & 1;
      if (local_265 != 0) {
        in_stack_fffffffffffffaa0 = &local_478;
        memset(in_stack_fffffffffffffaa0,0,0x210);
        in_stack_fffffffffffffa90 = "chromaticities";
        __x = (value_type *)0x100;
        strncpy((char *)in_stack_fffffffffffffaa0,"chromaticities",0x100);
        strncpy(local_378,in_stack_fffffffffffffa90,(size_t)__x);
        local_270 = 0x20;
        local_278 = local_264;
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                   in_stack_fffffffffffffaa0,__x);
      }
      saveEXR::EXRStruct::addAttributesToHeader(in_stack_fffffffffffffaa0);
      local_480 = (void *)SaveEXRImageToMemory
                                    ((EXRImage *)exr.header.custom_attributes,
                                     (EXRHeader *)exr.header._88_8_,(uchar **)exr.header._80_8_,
                                     (char **)exr.header._72_8_);
      if (local_480 == (void *)0x0) {
        Reporter::fatal<char_const(&)[23],char_const*&>
                  (in_stack_fffffffffffffb08,in_stack_fffffffffffffaf8._12_4_,
                   in_stack_fffffffffffffaf8._0_8_,
                   (char **)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      }
      OutputStream::OutputStream
                (in_stack_fffffffffffffb30,(string *)CONCAT44(uVar15,in_stack_fffffffffffffb28),
                 report);
      OutputStream::write(&local_4a8,local_168,local_480,in_RDI + 8);
      OutputStream::~OutputStream((OutputStream *)in_stack_fffffffffffffa90);
      saveEXR::EXRStruct::~EXRStruct((EXRStruct *)in_stack_fffffffffffffa90);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)in_stack_fffffffffffffaa0);
      std::vector<Channel,_std::allocator<Channel>_>::~vector
                ((vector<Channel,_std::allocator<Channel>_> *)in_stack_fffffffffffffaa0);
      return;
    }
    for (local_f4 = 0; local_f4 < local_24; local_f4 = local_f4 + 1) {
      local_100 = (undefined4 *)
                  (in_stack_00000018 + (ulong)((local_f0 * local_24 + local_f4) * local_a4));
      if (local_18 == 0x7b) {
        if (local_a8 != 3) {
          __assert_fail("numChannels == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x3a2,
                        "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                       );
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000010,0);
        if (*pvVar7 != 1) {
          __assert_fail("pixelTypes[0] == TINYEXR_PIXELTYPE_HALF",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x3a3,
                        "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                       );
        }
        local_104 = *local_100;
        vVar13 = glm::unpackF3x9_E1x5(in_stack_fffffffffffffac4);
        in_stack_fffffffffffffaf4 = vVar13.field_0._8_4_;
        local_120 = vVar13.field_0._0_8_;
        in_stack_fffffffffffffaf8._8_4_ = extraout_XMM0_Dc;
        in_stack_fffffffffffffaf8._0_8_ = local_120;
        in_stack_fffffffffffffaf8._12_4_ = extraout_XMM0_Dd;
        local_118 = in_stack_fffffffffffffaf4;
        local_110 = local_120;
        local_108 = in_stack_fffffffffffffaf4;
        uVar3 = imageio::bit_cast<unsigned_int,float>((float *)&local_110);
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&local_c0,2);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar8,(ulong)(local_f0 * local_24 + local_f4));
        *pvVar9 = uVar3;
        uVar3 = imageio::bit_cast<unsigned_int,float>((float *)((long)&local_110 + 4));
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&local_c0,1);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar8,(ulong)(local_f0 * local_24 + local_f4));
        *pvVar9 = uVar3;
        in_stack_fffffffffffffaf0 = imageio::bit_cast<unsigned_int,float>(&local_108);
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&local_c0,0);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar8,(ulong)(local_f0 * local_24 + local_f4));
        *pvVar9 = in_stack_fffffffffffffaf0;
      }
      else {
        for (local_124 = 0; local_124 < local_a8; local_124 = local_124 + 1) {
          local_130 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                                (&local_40,(ulong)local_124);
          local_134 = local_130->offset;
          local_138 = local_130->bits;
          local_13c = imageio::extract_bits<unsigned_int>
                                ((void *)CONCAT44(in_stack_fffffffffffffac4,
                                                  in_stack_fffffffffffffac0),
                                 in_stack_fffffffffffffabc,in_stack_fffffffffffffab8);
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](&local_c0,(ulong)local_124);
          local_148 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,(ulong)(local_f0 * local_24 + local_f4));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000010,(ulong)local_124);
          if ((*pvVar7 == 2) ||
             (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_stack_00000010,(ulong)local_124), *pvVar7 == 1)) {
            uVar4 = (uint32_t)in_stack_fffffffffffffa90;
            if ((local_130->isFloat & 1U) == 0) {
              uVar14 = (uint32_t)((ulong)in_stack_fffffffffffffa90 >> 0x20);
              if ((local_130->isNormalized & 1U) == 0) {
                if ((local_130->isSigned & 1U) == 0) {
                  local_160 = imageio::convertUIntToFloat(uVar14,uVar4);
                  uVar3 = imageio::bit_cast<unsigned_int,float>(&local_160);
                  *local_148 = uVar3;
                }
                else {
                  local_15c = imageio::convertSIntToFloat(uVar14,uVar4);
                  uVar3 = imageio::bit_cast<unsigned_int,float>(&local_15c);
                  *local_148 = uVar3;
                }
              }
              else if ((local_130->isSigned & 1U) == 0) {
                local_158 = imageio::convertUNORMToFloat(uVar14,uVar4);
                uVar3 = imageio::bit_cast<unsigned_int,float>(&local_158);
                *local_148 = uVar3;
              }
              else {
                local_154 = imageio::convertSNORMToFloat(uVar14,uVar4);
                uVar3 = imageio::bit_cast<unsigned_int,float>(&local_154);
                *local_148 = uVar3;
              }
            }
            else {
              uVar14 = (uint32_t)((ulong)in_stack_fffffffffffffa88 >> 0x20);
              if ((local_130->isSigned & 1U) == 0) {
                local_150 = imageio::convertUFloatToFloat(uVar4,uVar14);
                uVar3 = imageio::bit_cast<unsigned_int,float>(&local_150);
                *local_148 = uVar3;
              }
              else {
                local_14c = imageio::convertSFloatToFloat(uVar4,uVar14);
                uVar3 = imageio::bit_cast<unsigned_int,float>(&local_14c);
                *local_148 = uVar3;
              }
            }
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000010,(ulong)local_124);
            if (*pvVar7 != 0) {
              __assert_fail("false && \"Internal error\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3d1,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            uVar4 = (uint32_t)in_stack_fffffffffffffa90;
            if (((local_130->isFloat & 1U) == 0) || ((local_130->isSigned & 1U) == 0)) {
              uVar14 = (uint32_t)((ulong)in_stack_fffffffffffffa90 >> 0x20);
              if (((local_130->isFloat & 1U) == 0) || ((local_130->isSigned & 1U) != 0)) {
                if (((local_130->isFloat & 1U) == 0) && ((local_130->isSigned & 1U) != 0)) {
                  in_stack_fffffffffffffac0 = imageio::convertSIntToUInt(uVar14,uVar4);
                  *local_148 = in_stack_fffffffffffffac0;
                }
                else if (((local_130->isFloat & 1U) == 0) && ((local_130->isSigned & 1U) == 0)) {
                  in_stack_fffffffffffffabc = imageio::convertUIntToUInt(uVar14,uVar4);
                  *local_148 = in_stack_fffffffffffffabc;
                }
              }
              else {
                in_stack_fffffffffffffac4 = imageio::convertUFloatToUInt(uVar14,uVar4);
                *local_148 = in_stack_fffffffffffffac4;
              }
            }
            else {
              uVar4 = imageio::convertSFloatToUInt
                                (uVar4,(uint32_t)((ulong)in_stack_fffffffffffffa88 >> 0x20));
              *local_148 = uVar4;
            }
          }
        }
      }
    }
    local_f0 = local_f0 + 1;
  } while( true );
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const std::vector<int>& pixelTypes, const char* data, std::size_t size) {
    assert(!format.samples.empty());

    if (appendExtension && filepath != "-")
        filepath += ".exr";

    struct Channel {
        uint32_t offset;
        uint32_t bits;
        const char* name;
        bool isFloat;
        bool isSigned;
        bool isNormalized;
    };
    std::vector<Channel> channels;

    if (format.model() == KHR_DF_MODEL_RGBSDA) {
        const auto addChannel = [&](auto channelType, const char* channelName) {
            if (const auto sample = format.find(channelType))
                channels.push_back({
                        sample->bitOffset,
                        sample->bitLength + 1u,
                        channelName,
                        sample->qualifierFloat != 0,
                        sample->qualifierSigned != 0,
                        sample->upper != (sample->qualifierFloat != 0 ? bit_cast<uint32_t>(1.0f) : 1u)
                });
        };

        // Must be ABGR order, since most of EXR viewers expect this channel order by convention.
        addChannel(KHR_DF_CHANNEL_RGBSDA_A, "A");
        addChannel(KHR_DF_CHANNEL_RGBSDA_D, "D");
        addChannel(KHR_DF_CHANNEL_RGBSDA_S, "S");
        addChannel(KHR_DF_CHANNEL_RGBSDA_B, "B");
        addChannel(KHR_DF_CHANNEL_RGBSDA_G, "G");
        addChannel(KHR_DF_CHANNEL_RGBSDA_R, "R");
    // } else if (formatDescriptor.model() == KHR_DF_MODEL_YUVSDA) {
    // Other color model support would come here
    } else {
        fatal(rc::NOT_SUPPORTED, "EXR saving is unsupported for {} with {}.", toString(format.model()), toString(vkFormat));
    }

    const auto pixelBytes = format.pixelByteCount();
    const auto numChannels = vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount();
    assert(size == width * height * pixelBytes); (void) size;
    assert(numChannels == pixelTypes.size());

    // Image data is prepared with either floats or uint32
    // (half output is will be converted from float by TinyEXR during save)
    std::vector<std::vector<uint32_t>> images(numChannels);
    std::array<uint32_t*, 4> imagePtrs{};
    for (uint32_t i = 0; i < numChannels; ++i)
        images[i].resize(width * height);

    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < width; x++) {
            const char* rawPixel = data + (y * width + x) * pixelBytes;

            if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
                // Special case for VK_FORMAT_E5B9G9R9_UFLOAT_PACK32
                assert(numChannels == 3);
                assert(pixelTypes[0] == TINYEXR_PIXELTYPE_HALF);
                uint32_t pixel;
                std::memcpy(&pixel, rawPixel, sizeof(uint32_t));
                const auto values = glm::unpackF3x9_E1x5(pixel);
                images[2][y * width + x] = bit_cast<uint32_t>(values.r);
                images[1][y * width + x] = bit_cast<uint32_t>(values.g);
                images[0][y * width + x] = bit_cast<uint32_t>(values.b);
            } else {
                for (uint32_t c = 0; c < numChannels; c++) {
                    const auto& channel = channels[c];
                    const auto offset = channel.offset;
                    const auto bits = channel.bits;

                    const auto value = extract_bits<uint32_t>(rawPixel, offset, bits);
                    auto& target = images[c][y * width + x];

                    if (pixelTypes[c] == TINYEXR_PIXELTYPE_FLOAT || pixelTypes[c] == TINYEXR_PIXELTYPE_HALF) {
                        if (channel.isFloat) {
                            if (channel.isSigned)
                                target = bit_cast<uint32_t>(convertSFloatToFloat(value, bits));
                            else
                                target = bit_cast<uint32_t>(convertUFloatToFloat(value, bits));
                        } else {
                            if (channel.isNormalized) {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSNORMToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUNORMToFloat(value, bits));
                            } else {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSIntToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUIntToFloat(value, bits));
                            }
                        }
                    } else if (pixelTypes[c] == TINYEXR_PIXELTYPE_UINT) {
                        if (channel.isFloat && channel.isSigned) {
                            target = convertSFloatToUInt(value, bits);
                        } else if (channel.isFloat && !channel.isSigned) {
                            target = convertUFloatToUInt(value, bits);
                        } else if (!channel.isFloat && channel.isSigned) {
                            target = convertSIntToUInt(value, bits);
                        } else if (!channel.isFloat && !channel.isSigned) {
                            target = convertUIntToUInt(value, bits);
                        }
                    } else
                        assert(false && "Internal error");
                }
            }
        }
    }

    struct EXRStruct {
        EXRHeader header;
        EXRImage image;
        std::vector<EXRAttribute> attributes;
        const char* err = nullptr;
        unsigned char* fileData = nullptr;
        EXRStruct() {
            InitEXRHeader(&header);
            InitEXRImage(&image);
        }
        ~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }
        void addAttributesToHeader() {
            header.num_custom_attributes = static_cast<int>(attributes.size());
            header.custom_attributes = (EXRAttribute*)malloc(sizeof(EXRAttribute) * attributes.size());
            for (size_t i = 0; i < attributes.size(); ++i) {
                header.custom_attributes[i] = attributes[i];
            }
        }
    } exr;

    exr.image.images = reinterpret_cast<unsigned char**>(imagePtrs.data());
    exr.image.width = static_cast<int>(width);
    exr.image.height = static_cast<int>(height);
    exr.image.num_channels = static_cast<int>(numChannels);

    exr.header.num_channels = static_cast<int>(numChannels);
    exr.header.channels = (EXRChannelInfo*) malloc(sizeof(EXRChannelInfo) * exr.header.num_channels);
    // TODO: Question: Should we use a compression for exr outputs?
    exr.header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

    for (uint32_t c = 0; c < numChannels; c++) {
        const auto& channel = channels[c];
        strncpy(exr.header.channels[c].name, channel.name, 255);
        imagePtrs[c] = images[c].data();
    }

    exr.header.pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    exr.header.requested_pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    for (int i = 0; i < exr.header.num_channels; i++) {
        // pixel type of the input image
        exr.header.pixel_types[i] = (pixelTypes[i] == TINYEXR_PIXELTYPE_UINT) ? TINYEXR_PIXELTYPE_UINT : TINYEXR_PIXELTYPE_FLOAT;
        // pixel type of the output image to be stored in .EXR file
        exr.header.requested_pixel_types[i] = pixelTypes[i];
    }

    // Output primaries as chromaticities
    Primaries primaries;
    bool foundPrimaries = getPrimaries(format.primaries(), &primaries);
    if (foundPrimaries) {
        EXRAttribute chromaticities{};
        strncpy(chromaticities.name, "chromaticities", sizeof(chromaticities.name));
        strncpy(chromaticities.type, "chromaticities", sizeof(chromaticities.type));
        chromaticities.size = sizeof(primaries);
        chromaticities.value = reinterpret_cast<unsigned char*>(&primaries);

        exr.attributes.push_back(chromaticities);
    }

    exr.addAttributesToHeader();
    std::size_t fileDataSize = SaveEXRImageToMemory(&exr.image, &exr.header, &exr.fileData, &exr.err);
    if (fileDataSize == 0)
        fatal(rc::IO_FAILURE, "EXR Encoder error: {}.", exr.err);

    OutputStream file(filepath, *this);
    file.write(reinterpret_cast<const char*>(exr.fileData), fileDataSize, *this);
}